

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPen>::emplace<QPen_const&>
          (QMovableArrayOps<QPen> *this,qsizetype i,QPen *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  QPen *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPen tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar6;
  Inserter *this_00;
  Inserter local_38;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QPen>::needsDetach((QArrayDataPointer<QPen> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QPen>::freeSpaceAtEnd
                          ((QArrayDataPointer<QPen> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      QArrayDataPointer<QPen>::end((QArrayDataPointer<QPen> *)in_RDI);
      QPen::QPen((QPen *)in_RDI,
                 (QPen *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceTo = (QPen *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_003133da;
    }
    if ((in_RSI == (QPen *)0x0) &&
       (qVar3 = QArrayDataPointer<QPen>::freeSpaceAtBegin
                          ((QArrayDataPointer<QPen> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      QArrayDataPointer<QPen>::begin((QArrayDataPointer<QPen> *)0x3132b4);
      QPen::QPen((QPen *)in_RDI,
                 (QPen *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QPen *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_003133da;
    }
  }
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPen::QPen((QPen *)in_RDI,(QPen *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar4 = in_RDI->displaceTo != (QPen *)0x0;
  uVar5 = bVar4 && in_RSI == (QPen *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QPen *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QPen>::detachAndGrow
            ((QArrayDataPointer<QPen> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QPen **)CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QPen> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QPen> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QPen *)CONCAT17(uVar5,in_stack_ffffffffffffff98));
    Inserter::~Inserter(&local_38);
  }
  else {
    QArrayDataPointer<QPen>::begin((QArrayDataPointer<QPen> *)0x31336e);
    QPen::QPen((QPen *)in_RDI,(QPen *)CONCAT17(uVar5,in_stack_ffffffffffffff98));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QPen *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  QPen::~QPen((QPen *)0x3133da);
LAB_003133da:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }